

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.cc
# Opt level: O0

UntypedActionResultHolderBase * __thiscall
testing::internal::UntypedFunctionMockerBase::UntypedInvokeWith
          (UntypedFunctionMockerBase *this,void *untyped_args)

{
  CallReaction reaction_00;
  int iVar1;
  size_type sVar2;
  void *pvVar3;
  char *pcVar4;
  undefined4 extraout_var;
  UntypedFunctionMockerBase *pUVar5;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  ostream *poVar6;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  ostream *local_940;
  UntypedFunctionMockerBase *local_928;
  ostream *local_908;
  ostream *local_8f8;
  UntypedFunctionMockerBase *local_8d8;
  bool local_8b1;
  undefined1 *local_8a0;
  ostream *local_890;
  undefined1 *local_878;
  undefined1 *local_858;
  bool local_82a;
  bool local_829;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_820;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_800;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7e0;
  string local_7c0;
  string local_7a0;
  string local_780 [39];
  byte local_759;
  string local_758 [32];
  UntypedFunctionMockerBase *local_738;
  UntypedActionResultHolderBase *result;
  string local_728 [38];
  bool local_702;
  byte local_701;
  bool need_to_report_call;
  ExpectationBase *pEStack_700;
  bool found;
  ExpectationBase *untyped_expectation;
  void *untyped_action;
  stringstream loc;
  ostream aoStack_6e0 [376];
  stringstream local_568 [8];
  stringstream why;
  undefined1 auStack_558 [376];
  stringstream local_3e0 [8];
  stringstream ss;
  ostream local_3d0 [383];
  byte local_251;
  undefined1 local_250 [7];
  bool is_excessive;
  string local_230 [32];
  UntypedFunctionMockerBase *local_210;
  UntypedActionResultHolderBase *result_1;
  stringstream ss_1;
  undefined1 auStack_1f8 [399];
  allocator local_69;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  bool local_25;
  CallReaction local_24;
  bool need_to_report_uninteresting_call;
  void *pvStack_20;
  CallReaction reaction;
  void *untyped_args_local;
  UntypedFunctionMockerBase *this_local;
  undefined4 extraout_var_00;
  
  pvStack_20 = untyped_args;
  untyped_args_local = this;
  sVar2 = std::
          vector<testing::internal::linked_ptr<testing::internal::ExpectationBase>,_std::allocator<testing::internal::linked_ptr<testing::internal::ExpectationBase>_>_>
          ::size(&this->untyped_expectations_);
  if (sVar2 == 0) {
    pvVar3 = MockObject(this);
    local_24 = Mock::GetReactionOnUninterestingCalls(pvVar3);
    if (local_24 == kAllow) {
      local_829 = LogIsVisible(kInfo);
    }
    else {
      if (local_24 == kWarn) {
        local_82a = LogIsVisible(kWarning);
      }
      else {
        local_82a = true;
      }
      local_829 = local_82a;
    }
    pvVar3 = pvStack_20;
    local_25 = local_829;
    if (local_829 == false) {
      pcVar4 = Name(this);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_68,pcVar4,&local_69);
      std::operator+(&local_48,"Function call: ",&local_68);
      iVar1 = (*this->_vptr_UntypedFunctionMockerBase[3])(this,pvVar3,&local_48);
      this_local = (UntypedFunctionMockerBase *)CONCAT44(extraout_var,iVar1);
      std::__cxx11::string::~string((string *)&local_48);
      std::__cxx11::string::~string((string *)&local_68);
      std::allocator<char>::~allocator((allocator<char> *)&local_69);
    }
    else {
      std::__cxx11::stringstream::stringstream((stringstream *)&result_1);
      local_858 = (undefined1 *)0x0;
      if (&stack0x00000000 != (undefined1 *)0x208) {
        local_858 = auStack_1f8;
      }
      (*this->_vptr_UntypedFunctionMockerBase[5])(this,pvStack_20,local_858);
      pvVar3 = pvStack_20;
      std::__cxx11::stringstream::str();
      iVar1 = (*this->_vptr_UntypedFunctionMockerBase[3])(this,pvVar3,local_230);
      pUVar5 = (UntypedFunctionMockerBase *)CONCAT44(extraout_var_00,iVar1);
      std::__cxx11::string::~string(local_230);
      local_210 = pUVar5;
      if (pUVar5 != (UntypedFunctionMockerBase *)0x0) {
        local_878 = (undefined1 *)0x0;
        if (&stack0x00000000 != (undefined1 *)0x208) {
          local_878 = auStack_1f8;
        }
        (*pUVar5->_vptr_UntypedFunctionMockerBase[2])(pUVar5,local_878);
      }
      reaction_00 = local_24;
      std::__cxx11::stringstream::str();
      ReportUninterestingCall(reaction_00,(string *)local_250);
      std::__cxx11::string::~string((string *)local_250);
      this_local = local_210;
      std::__cxx11::stringstream::~stringstream((stringstream *)&result_1);
    }
  }
  else {
    local_251 = 0;
    std::__cxx11::stringstream::stringstream(local_3e0);
    std::__cxx11::stringstream::stringstream(local_568);
    std::__cxx11::stringstream::stringstream((stringstream *)&untyped_action);
    untyped_expectation = (ExpectationBase *)0x0;
    local_890 = (ostream *)0x0;
    if (&stack0x00000000 != (undefined1 *)0x3e0) {
      local_890 = local_3d0;
    }
    local_8a0 = (undefined1 *)0x0;
    if (&stack0x00000000 != (undefined1 *)0x568) {
      local_8a0 = auStack_558;
    }
    iVar1 = (*this->_vptr_UntypedFunctionMockerBase[6])
                      (this,pvStack_20,&untyped_expectation,&local_251,local_890,local_8a0);
    pEStack_700 = (ExpectationBase *)CONCAT44(extraout_var_01,iVar1);
    local_701 = pEStack_700 != (ExpectationBase *)0x0;
    local_8b1 = true;
    if (((bool)local_701) && (local_8b1 = true, (local_251 & 1) == 0)) {
      local_8b1 = LogIsVisible(kInfo);
    }
    pvVar3 = pvStack_20;
    local_702 = local_8b1;
    if (local_8b1 == false) {
      result._6_1_ = 0;
      result._5_1_ = 0;
      if (untyped_expectation == (ExpectationBase *)0x0) {
        std::allocator<char>::allocator();
        result._6_1_ = 1;
        std::__cxx11::string::string(local_728,"",(allocator *)((long)&result + 7));
        result._5_1_ = 1;
        iVar1 = (*this->_vptr_UntypedFunctionMockerBase[3])(this,pvVar3,local_728);
        local_8d8 = (UntypedFunctionMockerBase *)CONCAT44(extraout_var_02,iVar1);
      }
      else {
        iVar1 = (*this->_vptr_UntypedFunctionMockerBase[4])(this,untyped_expectation,pvStack_20);
        local_8d8 = (UntypedFunctionMockerBase *)CONCAT44(extraout_var_03,iVar1);
      }
      this_local = local_8d8;
      if ((result._5_1_ & 1) != 0) {
        std::__cxx11::string::~string(local_728);
      }
      if ((result._6_1_ & 1) != 0) {
        std::allocator<char>::~allocator((allocator<char> *)((long)&result + 7));
      }
    }
    else {
      poVar6 = std::operator<<(local_3d0,"    Function call: ");
      pcVar4 = Name(this);
      std::operator<<(poVar6,pcVar4);
      local_8f8 = (ostream *)0x0;
      if (&stack0x00000000 != (undefined1 *)0x3e0) {
        local_8f8 = local_3d0;
      }
      (*this->_vptr_UntypedFunctionMockerBase[7])(this,pvStack_20,local_8f8);
      if (((local_701 & 1) != 0) && ((local_251 & 1) == 0)) {
        local_908 = (ostream *)0x0;
        if (&stack0x00000000 != (undefined1 *)0x6f0) {
          local_908 = aoStack_6e0;
        }
        ExpectationBase::DescribeLocationTo(pEStack_700,local_908);
      }
      pvVar3 = pvStack_20;
      local_759 = 0;
      if (untyped_expectation == (ExpectationBase *)0x0) {
        std::__cxx11::stringstream::str();
        local_759 = 1;
        iVar1 = (*this->_vptr_UntypedFunctionMockerBase[3])(this,pvVar3,local_758);
        local_928 = (UntypedFunctionMockerBase *)CONCAT44(extraout_var_04,iVar1);
      }
      else {
        iVar1 = (*this->_vptr_UntypedFunctionMockerBase[4])(this,untyped_expectation,pvStack_20);
        local_928 = (UntypedFunctionMockerBase *)CONCAT44(extraout_var_05,iVar1);
      }
      if ((local_759 & 1) != 0) {
        std::__cxx11::string::~string(local_758);
      }
      local_738 = local_928;
      if (local_928 != (UntypedFunctionMockerBase *)0x0) {
        local_940 = (ostream *)0x0;
        if (&stack0x00000000 != (undefined1 *)0x3e0) {
          local_940 = local_3d0;
        }
        (*local_928->_vptr_UntypedFunctionMockerBase[2])(local_928,local_940);
      }
      poVar6 = std::operator<<(local_3d0,"\n");
      std::__cxx11::stringstream::str();
      std::operator<<(poVar6,local_780);
      std::__cxx11::string::~string(local_780);
      if ((local_701 & 1) == 0) {
        std::__cxx11::stringstream::str();
        Expect(false,(char *)0x0,-1,&local_7a0);
        std::__cxx11::string::~string((string *)&local_7a0);
      }
      else if ((local_251 & 1) == 0) {
        std::__cxx11::stringstream::str();
        std::__cxx11::stringstream::str();
        std::operator+(&local_7e0,&local_800,&local_820);
        Log(kInfo,&local_7e0,2);
        std::__cxx11::string::~string((string *)&local_7e0);
        std::__cxx11::string::~string((string *)&local_820);
        std::__cxx11::string::~string((string *)&local_800);
      }
      else {
        pcVar4 = ExpectationBase::file(pEStack_700);
        iVar1 = ExpectationBase::line(pEStack_700);
        std::__cxx11::stringstream::str();
        Expect(false,pcVar4,iVar1,&local_7c0);
        std::__cxx11::string::~string((string *)&local_7c0);
      }
      this_local = local_738;
    }
    result._0_4_ = 1;
    std::__cxx11::stringstream::~stringstream((stringstream *)&untyped_action);
    std::__cxx11::stringstream::~stringstream(local_568);
    std::__cxx11::stringstream::~stringstream(local_3e0);
  }
  return (UntypedActionResultHolderBase *)this_local;
}

Assistant:

GTEST_LOCK_EXCLUDED_(g_gmock_mutex) {
  // See the definition of untyped_expectations_ for why access to it
  // is unprotected here.
  if (untyped_expectations_.size() == 0) {
    // No expectation is set on this mock method - we have an
    // uninteresting call.

    // We must get Google Mock's reaction on uninteresting calls
    // made on this mock object BEFORE performing the action,
    // because the action may DELETE the mock object and make the
    // following expression meaningless.
    const CallReaction reaction =
        Mock::GetReactionOnUninterestingCalls(MockObject());

    // True iff we need to print this call's arguments and return
    // value.  This definition must be kept in sync with
    // the behavior of ReportUninterestingCall().
    const bool need_to_report_uninteresting_call =
        // If the user allows this uninteresting call, we print it
        // only when they want informational messages.
        reaction == kAllow ? LogIsVisible(kInfo) :
                           // If the user wants this to be a warning, we print
                           // it only when they want to see warnings.
            reaction == kWarn
                ? LogIsVisible(kWarning)
                :
                // Otherwise, the user wants this to be an error, and we
                // should always print detailed information in the error.
                true;

    if (!need_to_report_uninteresting_call) {
      // Perform the action without printing the call information.
      return this->UntypedPerformDefaultAction(
          untyped_args, "Function call: " + std::string(Name()));
    }

    // Warns about the uninteresting call.
    ::std::stringstream ss;
    this->UntypedDescribeUninterestingCall(untyped_args, &ss);

    // Calculates the function result.
    UntypedActionResultHolderBase* const result =
        this->UntypedPerformDefaultAction(untyped_args, ss.str());

    // Prints the function result.
    if (result != NULL)
      result->PrintAsActionResult(&ss);

    ReportUninterestingCall(reaction, ss.str());
    return result;
  }

  bool is_excessive = false;
  ::std::stringstream ss;
  ::std::stringstream why;
  ::std::stringstream loc;
  const void* untyped_action = NULL;

  // The UntypedFindMatchingExpectation() function acquires and
  // releases g_gmock_mutex.
  const ExpectationBase* const untyped_expectation =
      this->UntypedFindMatchingExpectation(
          untyped_args, &untyped_action, &is_excessive,
          &ss, &why);
  const bool found = untyped_expectation != NULL;

  // True iff we need to print the call's arguments and return value.
  // This definition must be kept in sync with the uses of Expect()
  // and Log() in this function.
  const bool need_to_report_call =
      !found || is_excessive || LogIsVisible(kInfo);
  if (!need_to_report_call) {
    // Perform the action without printing the call information.
    return
        untyped_action == NULL ?
        this->UntypedPerformDefaultAction(untyped_args, "") :
        this->UntypedPerformAction(untyped_action, untyped_args);
  }

  ss << "    Function call: " << Name();
  this->UntypedPrintArgs(untyped_args, &ss);

  // In case the action deletes a piece of the expectation, we
  // generate the message beforehand.
  if (found && !is_excessive) {
    untyped_expectation->DescribeLocationTo(&loc);
  }

  UntypedActionResultHolderBase* const result =
      untyped_action == NULL ?
      this->UntypedPerformDefaultAction(untyped_args, ss.str()) :
      this->UntypedPerformAction(untyped_action, untyped_args);
  if (result != NULL)
    result->PrintAsActionResult(&ss);
  ss << "\n" << why.str();

  if (!found) {
    // No expectation matches this call - reports a failure.
    Expect(false, NULL, -1, ss.str());
  } else if (is_excessive) {
    // We had an upper-bound violation and the failure message is in ss.
    Expect(false, untyped_expectation->file(),
           untyped_expectation->line(), ss.str());
  } else {
    // We had an expected call and the matching expectation is
    // described in ss.
    Log(kInfo, loc.str() + ss.str(), 2);
  }

  return result;
}